

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O1

void __thiscall EnrichableSpiAnalyzer::WorkerThread(EnrichableSpiAnalyzer *this)

{
  EnrichableAnalyzerSubprocess *this_00;
  allocator local_39;
  string local_38;
  
  Setup(this);
  this_00 = (this->mSubprocess)._M_ptr;
  std::__cxx11::string::string
            ((string *)&local_38,((this->mSettings)._M_ptr)->mParserCommand,&local_39);
  EnrichableAnalyzerSubprocess::SetParserCommand(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  EnrichableAnalyzerSubprocess::Start((this->mSubprocess)._M_ptr);
  AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
  do {
    GetWord(this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void EnrichableSpiAnalyzer::WorkerThread()
{
	Setup();

	mSubprocess->SetParserCommand(mSettings->mParserCommand);
	mSubprocess->Start();

	AdvanceToActiveEnableEdgeWithCorrectClockPolarity();

	for( ; ; )
	{
		GetWord();
		CheckIfThreadShouldExit();
	}

	mSubprocess->Stop();
}